

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbwindow.cpp
# Opt level: O2

void __thiscall QFbWindow::repaint(QFbWindow *this,QRegion *region)

{
  QRect QVar1;
  bool bVar2;
  QFbScreen *pQVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  long in_FS_OFFSET;
  QRect local_88;
  QRect local_78;
  QPoint local_60;
  QRect local_58;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = (QRect)(**(code **)(*(long *)this + 0x30))();
  local_58.x1.m_i = (this->mOldGeometry).x1.m_i;
  local_58.y1.m_i = (this->mOldGeometry).y1.m_i;
  local_58.x2.m_i = (this->mOldGeometry).x2.m_i;
  local_58.y2.m_i = (this->mOldGeometry).y2.m_i;
  this->mOldGeometry = local_48;
  bVar2 = operator!=(&local_58,&local_48);
  QVar1 = local_48;
  if (bVar2) {
    pQVar3 = platformScreen(this);
    (**(code **)(*(long *)pQVar3 + 0xd0))(pQVar3,&local_58);
    QVar1 = local_48;
  }
  local_48._0_8_ = QVar1._0_8_;
  local_60.xp.m_i = local_48.x1.m_i;
  local_60.yp.m_i = local_48.y1.m_i;
  local_48 = QVar1;
  puVar4 = (undefined8 *)QRegion::begin();
  puVar5 = (undefined8 *)QRegion::end();
  for (; puVar4 != puVar5; puVar4 = puVar4 + 2) {
    local_78._0_8_ = *puVar4;
    local_78._8_8_ = puVar4[1];
    pQVar3 = platformScreen(this);
    local_88 = QRect::translated(&local_78,&local_60);
    (**(code **)(*(long *)pQVar3 + 0xd0))(pQVar3,&local_88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFbWindow::repaint(const QRegion &region)
{
    const QRect currentGeometry = geometry();
    const QRect oldGeometryLocal = mOldGeometry;
    mOldGeometry = currentGeometry;
    // If this is a move, redraw the previous location
    if (oldGeometryLocal != currentGeometry)
        platformScreen()->setDirty(oldGeometryLocal);
    auto topLeft = currentGeometry.topLeft();
    for (auto rect : region)
        platformScreen()->setDirty(rect.translated(topLeft));
}